

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O3

void __thiscall TCLAP::ValueArg<char>::_extractValue(ValueArg<char> *this,string *val)

{
  undefined1 *destVal;
  Constraint<char> *pCVar1;
  char cVar2;
  CmdLineParseException *this_00;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ValueLike local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  destVal = &(this->super_Arg).field_0xa3;
  local_70._vptr_ValueLike = (_func_int **)&PTR__ValueLike_0011d920;
  ExtractValue<char>(destVal,val,&local_70);
  pCVar1 = this->_constraint;
  if (pCVar1 != (Constraint<char> *)0x0) {
    cVar2 = (**(code **)(*(long *)pCVar1 + 0x10))(pCVar1,destVal);
    if (cVar2 == '\0') {
      this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::operator+(&local_90,"Value \'",val);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar4) {
        local_d0.field_2._M_allocated_capacity = *psVar4;
        local_d0.field_2._8_4_ = (undefined4)plVar3[3];
        local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar4;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      (*(code *)**(undefined8 **)this->_constraint)(&local_48);
      std::operator+(&local_b0,&local_d0,&local_48);
      (*(this->super_Arg)._vptr_Arg[7])(&local_68,this);
      CmdLineParseException::CmdLineParseException(this_00,&local_b0,&local_68);
      __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
    }
  }
  return;
}

Assistant:

void ValueArg<T>::_extractValue( const std::string& val ) 
{
  try {
    ExtractValue(_value, val, typename ArgTraits<T>::ValueCategory());
  } catch( ArgParseException &e) {
    throw ArgParseException(e.error(), toString());
  }
    
  if ( _constraint != NULL )
    if ( ! _constraint->check( _value ) )
      throw( CmdLineParseException( "Value '" + val + 
                                    + "' does not meet constraint: " 
                                    + _constraint->description(),
                                    toString() ) );
}